

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

float_t __thiscall djb::beckmann::ndf_std_radial(beckmann *this,float_t zm)

{
  float_t fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = 0.0;
  if (0.0 < zm) {
    fVar3 = zm * zm;
    fVar2 = expf(-(1.0 / fVar3 + -1.0));
    fVar1 = fVar2 / (fVar3 * fVar3 * 3.1415927);
  }
  return fVar1;
}

Assistant:

float_t beckmann::ndf_std_radial(float_t zm) const
{
	if (zm > 0) {
		float_t rm_sqr = 1 / sqr(zm) - 1;
		return exp(-rm_sqr) / (sqr(sqr(zm)) * m_pi());
	}
	return 0;
}